

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void CONTEXTToNativeContext(CONTEXT *lpContext,native_context_t *native)

{
  undefined8 uVar1;
  _libc_fpxreg *p_Var2;
  _libc_xmmreg *p_Var3;
  undefined8 *puVar4;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  native_context_t *native_local;
  CONTEXT *lpContext_local;
  
  if ((lpContext->ContextFlags & 0x100001) == 0x100001) {
    (native->uc_mcontext).gregs[10] = lpContext->Rbp;
    (native->uc_mcontext).gregs[0x10] = lpContext->Rip;
    *(WORD *)((native->uc_mcontext).gregs + 0x12) = lpContext->SegCs;
    (native->uc_mcontext).gregs[0x11] = (ulong)lpContext->EFlags;
    (native->uc_mcontext).gregs[0xf] = lpContext->Rsp;
  }
  if ((lpContext->ContextFlags & 0x100002) == 0x100002) {
    (native->uc_mcontext).gregs[8] = lpContext->Rdi;
    (native->uc_mcontext).gregs[9] = lpContext->Rsi;
    (native->uc_mcontext).gregs[0xb] = lpContext->Rbx;
    (native->uc_mcontext).gregs[0xc] = lpContext->Rdx;
    (native->uc_mcontext).gregs[0xe] = lpContext->Rcx;
    (native->uc_mcontext).gregs[0xd] = lpContext->Rax;
    (native->uc_mcontext).gregs[0] = lpContext->R8;
    (native->uc_mcontext).gregs[1] = lpContext->R9;
    (native->uc_mcontext).gregs[2] = lpContext->R10;
    (native->uc_mcontext).gregs[3] = lpContext->R11;
    (native->uc_mcontext).gregs[4] = lpContext->R12;
    (native->uc_mcontext).gregs[5] = lpContext->R13;
    (native->uc_mcontext).gregs[6] = lpContext->R14;
    (native->uc_mcontext).gregs[7] = lpContext->R15;
  }
  if (((native->uc_mcontext).fpregs != (fpregset_t)0x0) &&
     ((lpContext->ContextFlags & 0x100008) == 0x100008)) {
    ((native->uc_mcontext).fpregs)->cwd = (lpContext->field_38).FltSave.ControlWord;
    ((native->uc_mcontext).fpregs)->swd = (lpContext->field_38).FltSave.StatusWord;
    ((native->uc_mcontext).fpregs)->ftw = (ushort)(lpContext->field_38).FltSave.TagWord;
    *(DWORD *)&((native->uc_mcontext).fpregs)->rip = (lpContext->field_38).FltSave.ErrorOffset;
    *(WORD *)((long)&((native->uc_mcontext).fpregs)->rip + 4) =
         (lpContext->field_38).FltSave.ErrorSelector;
    *(DWORD *)&((native->uc_mcontext).fpregs)->rdp = (lpContext->field_38).FltSave.DataOffset;
    *(WORD *)((long)&((native->uc_mcontext).fpregs)->rdp + 4) =
         (lpContext->field_38).FltSave.DataSelector;
    ((native->uc_mcontext).fpregs)->mxcsr = (lpContext->field_38).FltSave.MxCsr;
    ((native->uc_mcontext).fpregs)->mxcr_mask = (lpContext->field_38).FltSave.MxCsr_Mask;
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      puVar4 = (undefined8 *)((long)&lpContext->field_38 + (long)local_1c * 0x10 + 0x20);
      p_Var2 = ((native->uc_mcontext).fpregs)->_st + local_1c;
      *(undefined8 *)p_Var2->significand = *puVar4;
      uVar1 = puVar4[1];
      p_Var2->exponent = (short)uVar1;
      p_Var2->__glibc_reserved1[0] = (short)((ulong)uVar1 >> 0x10);
      p_Var2->__glibc_reserved1[1] = (short)((ulong)uVar1 >> 0x20);
      p_Var2->__glibc_reserved1[2] = (short)((ulong)uVar1 >> 0x30);
    }
    for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
      puVar4 = (undefined8 *)((long)&lpContext->field_38 + (long)local_20 * 0x10 + 0xa0);
      p_Var3 = ((native->uc_mcontext).fpregs)->_xmm + local_20;
      *(undefined8 *)p_Var3->element = *puVar4;
      *(undefined8 *)(p_Var3->element + 2) = puVar4[1];
    }
  }
  return;
}

Assistant:

void CONTEXTToNativeContext(CONST CONTEXT *lpContext, native_context_t *native)
{
#define ASSIGN_REG(reg) MCREG_##reg(native->uc_mcontext) = lpContext->reg;
    if ((lpContext->ContextFlags & CONTEXT_CONTROL) == CONTEXT_CONTROL)
    {
        ASSIGN_CONTROL_REGS
    }

    if ((lpContext->ContextFlags & CONTEXT_INTEGER) == CONTEXT_INTEGER)
    {
        ASSIGN_INTEGER_REGS
    }
#undef ASSIGN_REG

#if !HAVE_FPREGS_WITH_CW
#if (HAVE_GREGSET_T || HAVE___GREGSET_T) && !defined(HOST_S390X) && !defined(HOST_LOONGARCH64) && !defined(HOST_RISCV64) && !defined(HOST_POWERPC64)
#if HAVE_GREGSET_T
    if (native->uc_mcontext.fpregs == nullptr)
#elif HAVE___GREGSET_T
    if (native->uc_mcontext.__fpregs == nullptr)
#endif // HAVE_GREGSET_T
    {
        // If the pointer to the floating point state in the native context
        // is not valid, we can't copy floating point registers regardless of
        // whether CONTEXT_FLOATING_POINT is set in the CONTEXT's flags.
        return;
    }
#endif // (HAVE_GREGSET_T || HAVE___GREGSET_T) && !HOST_S390X && !HOST_LOONGARCH64 && !HOST_RISCV64 && !HOST_POWERPC64
#endif // !HAVE_FPREGS_WITH_CW

    if ((lpContext->ContextFlags & CONTEXT_FLOATING_POINT) == CONTEXT_FLOATING_POINT)
    {
#ifdef _AMD64_
        FPREG_ControlWord(native) = lpContext->FltSave.ControlWord;
        FPREG_StatusWord(native) = lpContext->FltSave.StatusWord;
#if HAVE_FPREGS_WITH_CW
        FPREG_TagWord1(native) = lpContext->FltSave.TagWord >> 8;
        FPREG_TagWord2(native) = lpContext->FltSave.TagWord & 0xff;
#else
        FPREG_TagWord(native) = lpContext->FltSave.TagWord;
#endif
        FPREG_ErrorOffset(native) = lpContext->FltSave.ErrorOffset;
        FPREG_ErrorSelector(native) = lpContext->FltSave.ErrorSelector;
        FPREG_DataOffset(native) = lpContext->FltSave.DataOffset;
        FPREG_DataSelector(native) = lpContext->FltSave.DataSelector;
        FPREG_MxCsr(native) = lpContext->FltSave.MxCsr;
        FPREG_MxCsr_Mask(native) = lpContext->FltSave.MxCsr_Mask;

        for (int i = 0; i < 8; i++)
        {
            FPREG_St(native, i) = lpContext->FltSave.FloatRegisters[i];
        }

        for (int i = 0; i < 16; i++)
        {
            FPREG_Xmm(native, i) = lpContext->FltSave.XmmRegisters[i];
        }
#elif defined(_ARM64_)
#ifdef __APPLE__
        _STRUCT_ARM_NEON_STATE64* fp = GetNativeSigSimdContext(native);
        fp->__fpsr = lpContext->Fpsr;
        fp->__fpcr = lpContext->Fpcr;
        for (int i = 0; i < 32; i++)
        {
            *(NEON128*) &fp->__v[i] = lpContext->V[i];
        }
#else // __APPLE__
        fpsimd_context* fp = GetNativeSigSimdContext(native);
        if (fp)
        {
            fp->fpsr = lpContext->Fpsr;
            fp->fpcr = lpContext->Fpcr;
            for (int i = 0; i < 32; i++)
            {
                *(NEON128*) &fp->vregs[i] = lpContext->V[i];
            }
        }
#endif // __APPLE__
#elif defined(_ARM_)
        VfpSigFrame* fp = GetNativeSigSimdContext(native);
        if (fp)
        {
            fp->Fpscr = lpContext->Fpscr;
            for (int i = 0; i < 32; i++)
            {
                fp->D[i] = lpContext->D[i];
            }
        }
#elif defined(HOST_S390X)
        fpregset_t *fp = &native->uc_mcontext.fpregs;
        static_assert_no_msg(sizeof(fp->fprs) == sizeof(lpContext->Fpr));
        memcpy(fp->fprs, lpContext->Fpr, sizeof(lpContext->Fpr));
#elif defined(HOST_LOONGARCH64)
        native->uc_mcontext.__fcsr = lpContext->Fcsr;
        for (int i = 0; i < 32; i++)
        {
            native->uc_mcontext.__fpregs[i].__val64[0] = lpContext->F[i];
        }
#elif defined(HOST_RISCV64)
        native->uc_mcontext.__fpregs.__d.__fcsr = lpContext->Fcsr;
        for (int i = 0; i < 64; i++)
        {
            native->uc_mcontext.__fpregs.__d.__f[i] = lpContext->F[i];
        }
#endif
    }

    // TODO: Enable for all Unix systems
#if defined(_AMD64_) && defined(XSTATE_SUPPORTED)
    if ((lpContext->ContextFlags & CONTEXT_XSTATE) == CONTEXT_XSTATE)
    {
        _ASSERTE(FPREG_HasYmmRegisters(native));
        memcpy_s(FPREG_Xstate_Ymmh(native), sizeof(M128A) * 16, lpContext->VectorRegister, sizeof(M128A) * 16);
    }
#endif //_AMD64_ && XSTATE_SUPPORTED
}